

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucase.cpp
# Opt level: O0

UChar32 ucase_fold_63(UChar32 c,uint32_t options)

{
  ushort uVar1;
  ushort uVar2;
  sbyte sVar3;
  undefined2 *puVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  uint local_2c;
  int32_t delta;
  int32_t idx;
  uint16_t excWord;
  uint16_t *pe;
  uint uStack_10;
  uint16_t props;
  uint32_t options_local;
  UChar32 c_local;
  
  uVar5 = c >> 5;
  if ((uint)c < 0xd800) {
    local_3c = (uint)ucase_props_trieIndex[(int)uVar5] * 4 + (c & 0x1fU);
  }
  else {
    if ((uint)c < 0x10000) {
      iVar6 = 0;
      if (c < 0xdc00) {
        iVar6 = 0x140;
      }
      local_40 = (uint)ucase_props_trieIndex[(int)(iVar6 + uVar5)] * 4 + (c & 0x1fU);
    }
    else {
      if ((uint)c < 0x110000) {
        if (c < 0xe0800) {
          local_48 = (uint)ucase_props_trieIndex
                           [(int)((uint)ucase_props_trieIndex[(c >> 0xb) + 0x820] + (uVar5 & 0x3f))]
                     * 4 + (c & 0x1fU);
        }
        else {
          local_48 = 0x2f1c;
        }
        local_44 = local_48;
      }
      else {
        local_44 = 0xd30;
      }
      local_40 = local_44;
    }
    local_3c = local_40;
  }
  uVar1 = ucase_props_trieIndex[local_3c];
  if ((uVar1 & 8) == 0) {
    uStack_10 = c;
    if ((uVar1 & 2) != 0) {
      uStack_10 = ((int)(short)uVar1 >> 7) + c;
    }
  }
  else {
    lVar7 = (long)((int)(uint)uVar1 >> 4) * 2 + 0x436172;
    uVar2 = ucase_props_exceptions[(int)(uint)uVar1 >> 4];
    if ((uVar2 & 0x8000) != 0) {
      if ((options & 7) == 0) {
        if (c == 0x49) {
          return 0x69;
        }
        if (c == 0x130) {
          return 0x130;
        }
      }
      else {
        if (c == 0x49) {
          return 0x131;
        }
        if (c == 0x130) {
          return 0x69;
        }
      }
    }
    if ((uVar2 & 0x200) != 0) {
      return c;
    }
    if (((uVar2 & 0x10) != 0) && ((uVar1 & 2) != 0)) {
      if ((uVar2 & 0x100) == 0) {
        local_2c = (uint)*(ushort *)(lVar7 + (long)(int)(uint)""[(int)(uVar2 & 0xf)] * 2);
      }
      else {
        puVar4 = (undefined2 *)(lVar7 + (long)(int)((uint)""[(int)(uVar2 & 0xf)] << 1) * 2);
        local_2c = CONCAT22(*puVar4,puVar4[1]);
      }
      if ((uVar2 & 0x400) != 0) {
        local_2c = -local_2c;
      }
      local_4c = c + local_2c;
      return local_4c;
    }
    if ((uVar2 & 2) == 0) {
      if ((uVar2 & 1) == 0) {
        return c;
      }
      sVar3 = 0;
    }
    else {
      sVar3 = 1;
    }
    if ((uVar2 & 0x100) == 0) {
      uStack_10 = (uint)*(ushort *)
                         (lVar7 + (long)(int)(uint)""[(int)((uint)uVar2 & (1 << sVar3) - 1U)] * 2);
    }
    else {
      puVar4 = (undefined2 *)
               (lVar7 + (long)(int)((uint)""[(int)((uint)uVar2 & (1 << sVar3) - 1U)] << 1) * 2);
      uStack_10 = CONCAT22(*puVar4,puVar4[1]);
    }
  }
  return uStack_10;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
ucase_fold(UChar32 c, uint32_t options) {
    uint16_t props=UTRIE2_GET16(&ucase_props_singleton.trie, c);
    if(!UCASE_HAS_EXCEPTION(props)) {
        if(UCASE_IS_UPPER_OR_TITLE(props)) {
            c+=UCASE_GET_DELTA(props);
        }
    } else {
        const uint16_t *pe=GET_EXCEPTIONS(&ucase_props_singleton, props);
        uint16_t excWord=*pe++;
        int32_t idx;
        if(excWord&UCASE_EXC_CONDITIONAL_FOLD) {
            /* special case folding mappings, hardcoded */
            if((options&_FOLD_CASE_OPTIONS_MASK)==U_FOLD_CASE_DEFAULT) {
                /* default mappings */
                if(c==0x49) {
                    /* 0049; C; 0069; # LATIN CAPITAL LETTER I */
                    return 0x69;
                } else if(c==0x130) {
                    /* no simple case folding for U+0130 */
                    return c;
                }
            } else {
                /* Turkic mappings */
                if(c==0x49) {
                    /* 0049; T; 0131; # LATIN CAPITAL LETTER I */
                    return 0x131;
                } else if(c==0x130) {
                    /* 0130; T; 0069; # LATIN CAPITAL LETTER I WITH DOT ABOVE */
                    return 0x69;
                }
            }
        }
        if((excWord&UCASE_EXC_NO_SIMPLE_CASE_FOLDING)!=0) {
            return c;
        }
        if(HAS_SLOT(excWord, UCASE_EXC_DELTA) && UCASE_IS_UPPER_OR_TITLE(props)) {
            int32_t delta;
            GET_SLOT_VALUE(excWord, UCASE_EXC_DELTA, pe, delta);
            return (excWord&UCASE_EXC_DELTA_IS_NEGATIVE)==0 ? c+delta : c-delta;
        }
        if(HAS_SLOT(excWord, UCASE_EXC_FOLD)) {
            idx=UCASE_EXC_FOLD;
        } else if(HAS_SLOT(excWord, UCASE_EXC_LOWER)) {
            idx=UCASE_EXC_LOWER;
        } else {
            return c;
        }
        GET_SLOT_VALUE(excWord, idx, pe, c);
    }
    return c;
}